

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clCommandSVMMemFillKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,void *svm_ptr,void *pattern,
                 size_t pattern_size,size_t size,cl_uint num_sync_points_in_wait_list,
                 cl_sync_point_khr *sync_point_wait_list,cl_sync_point_khr *sync_point,
                 cl_mutable_command_khr *mutable_handle)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  cl_int errorCode;
  cl_int cVar4;
  CLIntercept *pCVar5;
  CLdispatchX *functionName;
  SConfig *pSVar6;
  undefined8 uVar7;
  time_point tVar8;
  time_point tickEnd;
  SConfig *pSVar9;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RCX;
  cl_command_properties_khr *in_RDX;
  cl_command_queue in_RSI;
  cl_command_buffer_khr in_RDI;
  void *in_R8;
  size_t in_R9;
  size_t in_stack_00000008;
  cl_uint in_stack_00000010;
  cl_sync_point_khr *in_stack_00000018;
  cl_sync_point_khr *in_stack_00000020;
  cl_mutable_command_khr *in_stack_00000028;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  string syncPointWaitList;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd80;
  CLIntercept *in_stack_fffffffffffffd88;
  CLIntercept *in_stack_fffffffffffffd90;
  cl_sync_point_khr *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  cl_uint cVar10;
  CLIntercept *in_stack_fffffffffffffda8;
  allocator *paVar11;
  CLIntercept *in_stack_fffffffffffffdc0;
  CLIntercept *this;
  cl_command_buffer_khr in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  SConfig *in_stack_fffffffffffffdf0;
  SConfig *in_stack_fffffffffffffdf8;
  SConfig *in_stack_fffffffffffffe00;
  CLIntercept *in_stack_fffffffffffffe10;
  allocator *in_stack_fffffffffffffe18;
  undefined1 includeId;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  SConfig *in_stack_fffffffffffffe28;
  CLIntercept *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  time_point in_stack_fffffffffffffe48;
  int local_164 [6];
  allocator local_149;
  string local_148 [39];
  undefined1 local_121 [56];
  allocator local_e9;
  string local_e8 [44];
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  string local_90 [36];
  
  cVar10 = (cl_uint)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  pCVar5 = GetIntercept();
  if ((pCVar5 == (CLIntercept *)0x0) ||
     (functionName = CLIntercept::dispatchX
                               (in_stack_fffffffffffffd90,
                                (cl_command_buffer_khr)in_stack_fffffffffffffd88),
     functionName->clCommandSVMMemFillKHR ==
     (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_void_ptr_void_ptr_size_t_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
      *)0x0)) {
    local_164[0] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_164);
    return -0x472;
  }
  register0x00000000 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd88);
  getFormattedSyncPointWaitList_abi_cxx11_
            (in_stack_fffffffffffffda8,cVar10,in_stack_fffffffffffffd98);
  pSVar6 = CLIntercept::config(pCVar5);
  uVar3 = stack0xffffffffffffff90;
  this = pCVar5;
  if ((pSVar6->CallLogging & 1U) != 0) {
    uVar7 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffd80 = in_RCX;
    CLIntercept::callLoggingEnter
              (pCVar5,"clCommandSVMMemFillKHR",uVar3,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, svm_ptr = %p, pattern_size = %zu, size = %zu%s"
               ,in_RDI,in_RSI,in_RCX,in_R9,in_stack_00000008,uVar7);
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd80);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd80);
  tVar8.__d.__r = (duration)CLIntercept::config(this);
  if (((((SConfig *)tVar8.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe48.__d.__r = (duration)CLIntercept::config(this),
     (((SConfig *)in_stack_fffffffffffffe48.__d.__r)->ChromeCallLogging & 1U) != 0)) {
    local_b8 = std::chrono::_V2::steady_clock::now();
    local_a8 = local_b8;
  }
  cVar4 = (*functionName->clCommandSVMMemFillKHR)
                    (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
                     in_stack_00000018,in_stack_00000020,in_stack_00000028);
  local_bc = cVar4;
  tickEnd.__d.__r = (duration)CLIntercept::config(this);
  if (((((SConfig *)tickEnd.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe30 = (CLIntercept *)CLIntercept::config(this),
     ((in_stack_fffffffffffffe30->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0)) {
    local_e8._32_8_ = std::chrono::_V2::steady_clock::now();
    local_b0 = local_e8._32_8_;
    in_stack_fffffffffffffe28 = CLIntercept::config(this);
    if (((in_stack_fffffffffffffe28->HostPerformanceTiming & 1U) != 0) &&
       (in_stack_fffffffffffffe27 =
             CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,stack0xffffffffffffff90),
       (bool)in_stack_fffffffffffffe27)) {
      in_stack_fffffffffffffe18 = &local_e9;
      pCVar5 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"",in_stack_fffffffffffffe18);
      local_121._41_8_ = local_a8;
      local_121._33_8_ = local_b0;
      CLIntercept::updateHostTimingStats
                ((CLIntercept *)CONCAT44(cVar4,in_stack_fffffffffffffe40),(char *)tickEnd.__d.__r,
                 (string *)in_stack_fffffffffffffe30,tVar8,in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      in_stack_fffffffffffffe10 = this;
      this = pCVar5;
    }
  }
  pSVar6 = CLIntercept::config(this);
  if (((pSVar6->ErrorLogging & 1U) == 0) &&
     (in_stack_fffffffffffffe00 = CLIntercept::config(this),
     (in_stack_fffffffffffffe00->ErrorAssert & 1U) == 0)) {
    in_stack_fffffffffffffdf8 = CLIntercept::config(this);
    cVar10 = (cl_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    if ((in_stack_fffffffffffffdf8->NoErrors & 1U) == 0) goto LAB_0018c480;
  }
  cVar10 = (cl_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  if (local_bc != 0) {
    in_stack_fffffffffffffdf0 = CLIntercept::config(this);
    uVar3 = stack0xffffffffffffff90;
    if ((in_stack_fffffffffffffdf0->ErrorLogging & 1U) != 0) {
      uVar1 = stack0xffffffffffffff90 >> 0x20;
      errorCode = (cl_int)uVar1;
      unique0x1000084d = uVar3;
      CLIntercept::logError(this,(char *)functionName,errorCode);
    }
    pSVar9 = CLIntercept::config(this);
    if ((pSVar9->ErrorAssert & 1U) != 0) {
      raise(5);
    }
    pSVar9 = CLIntercept::config(this);
    if ((pSVar9->NoErrors & 1U) != 0) {
      local_bc = 0;
    }
  }
LAB_0018c480:
  pCVar5 = this;
  if (((local_bc == 0) && (in_RDI != (cl_command_buffer_khr)0x0)) &&
     (pSVar9 = CLIntercept::config(this), pCVar5 = this, (pSVar9->DumpCommandBuffers & 1U) != 0)) {
    in_stack_fffffffffffffdd0 = (CLIntercept *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_121 + 1),"",(allocator *)in_stack_fffffffffffffdd0);
    CLIntercept::recordCommandBufferCommand
              ((CLIntercept *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (cl_command_buffer_khr)in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
               (string *)pSVar6,cVar10,(cl_sync_point_khr *)in_stack_fffffffffffffdf8,
               (cl_sync_point_khr *)in_stack_fffffffffffffe30);
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
    in_stack_fffffffffffffdc0 = this;
    in_stack_fffffffffffffdc8 = in_RDI;
  }
  includeId = (undefined1)((ulong)in_stack_fffffffffffffe18 >> 0x38);
  pSVar9 = CLIntercept::config(pCVar5);
  if ((pSVar9->CallLogging & 1U) != 0) {
    CLIntercept::callLoggingExit
              (in_stack_fffffffffffffe10,&pSVar6->SuppressLogging,cVar10,
               (cl_event *)in_stack_fffffffffffffdf8,(cl_sync_point_khr *)in_stack_fffffffffffffdf0)
    ;
  }
  cVar10 = (cl_uint)((ulong)pSVar9 >> 0x20);
  pSVar6 = CLIntercept::config(pCVar5);
  if ((pSVar6->ChromeCallLogging & 1U) != 0) {
    paVar11 = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",paVar11);
    local_164._12_8_ = local_a8;
    local_164._4_8_ = local_b0;
    tVar8.__d.__r._4_4_ = cVar4;
    tVar8.__d.__r._0_4_ = in_stack_fffffffffffffe40;
    CLIntercept::chromeCallLoggingExit
              (in_stack_fffffffffffffe30,&in_stack_fffffffffffffe28->SuppressLogging,
               (string *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (bool)includeId,(uint64_t)in_stack_fffffffffffffe10,tVar8,tickEnd);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  if ((in_stack_00000028 != (cl_mutable_command_khr *)0x0) &&
     (*in_stack_00000028 != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo
              (in_stack_fffffffffffffdd0,(cl_mutable_command_khr)in_stack_fffffffffffffdc8,
               (cl_command_buffer_khr)in_stack_fffffffffffffdc0,cVar10);
  }
  iVar2 = local_bc;
  std::__cxx11::string::~string(local_90);
  return iVar2;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandSVMMemFillKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    void* svm_ptr,
    const void* pattern,
    size_t pattern_size,
    size_t size,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandSVMMemFillKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, svm_ptr = %p, pattern_size = %zu, size = %zu%s",
                command_buffer,
                command_queue,
                svm_ptr,
                pattern_size,
                size,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandSVMMemFillKHR(
                command_buffer,
                command_queue,
                properties,
                svm_ptr,
                pattern,
                pattern_size,
                size,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}